

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

int lookupid(char *data,size_t length,name_entry_t *table,size_t count)

{
  int iVar1;
  void *pvVar2;
  char name [20];
  undefined1 auStack_38 [32];
  
  iVar1 = 0;
  if (length < 0x14) {
    if (length != 0) {
      memcpy(auStack_38,data,length);
    }
    auStack_38[length] = 0;
    pvVar2 = bsearch(auStack_38,table,count >> 4,0x10,name_entry_compare);
    if (pvVar2 == (void *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = *(int *)((long)pvVar2 + 8);
    }
  }
  return iVar1;
}

Assistant:

static int lookupid(const char* data, size_t length, const name_entry_t* table, size_t count)
{
    if(length > MAX_NAME)
        return 0;
    char name[MAX_NAME + 1];
    for(int i = 0; i < length; i++)
        name[i] = data[i];
    name[length] = '\0';

    name_entry_t* entry = bsearch(name, table, count / sizeof(name_entry_t), sizeof(name_entry_t), name_entry_compare);
    if(entry == NULL)
        return 0;
    return entry->id;
}